

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseEnum(Parser *this,bool is_union,EnumDef **dest,char *filename)

{
  Definition *pDVar1;
  bool bVar2;
  ulong uVar3;
  string *psVar4;
  char *__s;
  Value *pVVar5;
  StructDef *_sd;
  size_t sVar6;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar7;
  reference ppEVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  int64_t t;
  Type *this_00;
  int t_00;
  undefined7 in_register_00000031;
  Parser *this_01;
  pointer in_R8;
  pair<flatbuffers::BaseType,_flatbuffers::StructDef_*> pVar11;
  pair<std::_Rb_tree_const_iterator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_bool>
  pVar12;
  char local_69a;
  byte local_611;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  undefined1 local_560 [8];
  string qualified_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  EnumVal *local_480;
  EnumVal *ev_2;
  EnumVal *prev_ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_468;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  it_1;
  const_iterator prev_it;
  string local_450 [39];
  allocator<char> local_429;
  string local_428 [32];
  EnumVal **local_408;
  uint64_t u;
  EnumVal *ev_1;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_3f0;
  const_iterator it;
  uint64_t base_width;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0 [38];
  byte local_38a;
  byte local_389;
  byte local_388;
  byte local_387;
  byte local_386;
  byte local_385;
  byte local_384;
  byte local_383;
  byte local_382;
  byte local_381;
  _Base_ptr local_380;
  undefined1 local_378;
  value_type local_370;
  _Base_ptr local_360;
  pair<std::_Rb_tree_const_iterator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_bool>
  ins;
  undefined8 local_348;
  undefined8 local_340;
  undefined2 local_338;
  allocator<char> local_329;
  string local_328 [36];
  byte local_304;
  byte local_303;
  char local_302;
  char local_301;
  char *local_300;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  byte local_2ea;
  byte local_2e9;
  undefined1 local_2e8 [8];
  string full_name;
  EnumVal *ev;
  undefined1 local_2b8 [8];
  set<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::less<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::allocator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>_>
  union_types;
  string local_280;
  byte local_259;
  undefined1 local_258 [8];
  EnumValBuilder evb;
  string local_230 [39];
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  BaseType local_198;
  byte local_192;
  allocator<char> local_191;
  BaseType underlying_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  byte local_12b;
  byte local_12a;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [38];
  byte local_da;
  allocator<char> local_d9;
  undefined1 local_d8 [6];
  bool explicit_underlying_type;
  string local_b8;
  byte local_91;
  EnumDef *local_90;
  EnumDef *enum_def;
  string local_80 [8];
  string enum_name;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enum_comment;
  char *filename_local;
  EnumDef **dest_local;
  bool is_union_local;
  Parser *this_local;
  CheckedError *ce;
  
  this_01 = (Parser *)CONCAT71(in_register_00000031,is_union);
  enum_comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_R8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48,&(this_01->super_ParserState).doc_comment_);
  Next(this);
  enum_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
  enum_name.field_2._9_3_ = 0;
  if (!(bool)enum_name.field_2._M_local_buf[8]) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if (enum_name.field_2._8_4_ != 0) goto LAB_00126fe7;
  std::__cxx11::string::string(local_80,(string *)&(this_01->super_ParserState).attribute_);
  enum_def._7_1_ = 0;
  t_00 = (int)this_01;
  Expect(this,t_00);
  enum_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
  if ((bool)enum_name.field_2._M_local_buf[8]) {
    enum_def._7_1_ = 1;
  }
  enum_name.field_2._9_3_ = 0;
  if ((enum_def._7_1_ & 1) == 0) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if (enum_name.field_2._8_4_ == 0) {
    local_91 = 0;
    StartEnum(this,(string *)this_01,SUB81(local_80,0),(EnumDef **)(ulong)((byte)dest & 1));
    enum_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
    if ((bool)enum_name.field_2._M_local_buf[8]) {
      local_91 = 1;
    }
    enum_name.field_2._9_3_ = 0;
    if ((local_91 & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (enum_name.field_2._8_4_ == 0) {
      if ((enum_comment.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
         (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_d8,
                   (char *)enum_comment.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_d9);
        FilePath(&local_b8,&(this_01->opts).project_root,(string *)local_d8,
                 (bool)((this_01->opts).binary_schema_absolute_paths & 1));
        psVar4 = GetPooledString(this_01,&local_b8);
        (local_90->super_Definition).declaration_file = psVar4;
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)local_d8);
        std::allocator<char>::~allocator(&local_d9);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(local_90->super_Definition).doc_comment,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48);
      if (((this_01->opts).proto_mode & 1U) != 0) goto LAB_00125406;
      local_da = 0;
      bVar2 = Is(this_01,0x3a);
      if (bVar2) {
        if ((((ulong)dest & 1) == 0) || (bVar2 = SupportsUnionUnderlyingType(this_01), bVar2)) {
          local_12a = 0;
          Next(this);
          enum_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
          if ((bool)enum_name.field_2._M_local_buf[8]) {
            local_12a = 1;
          }
          enum_name.field_2._9_3_ = 0;
          if ((local_12a & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (enum_name.field_2._8_4_ == 0) {
            local_da = 1;
            goto LAB_001251aa;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_128,
                     "Underlying type for union is not yet supported in at least one of the specified programming languages."
                     ,&local_129);
          Error(this,(string *)this_01);
          std::__cxx11::string::~string(local_128);
          std::allocator<char>::~allocator(&local_129);
          enum_name.field_2._8_4_ = 1;
        }
      }
      else if (((ulong)dest & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_100,
                   "must specify the underlying integer type for this enum (e.g. \': short\', which was the default)."
                   ,&local_101);
        Error(this,(string *)this_01);
        std::__cxx11::string::~string(local_100);
        std::allocator<char>::~allocator(&local_101);
        enum_name.field_2._8_4_ = 1;
      }
      else {
LAB_001251aa:
        if ((local_da & 1) == 0) {
LAB_00125406:
          local_192 = 0;
          ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)this_01);
          enum_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
          if ((bool)enum_name.field_2._M_local_buf[8]) {
            local_192 = 1;
          }
          enum_name.field_2._9_3_ = 0;
          if ((local_192 & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (enum_name.field_2._8_4_ == 0) {
            local_198 = (local_90->underlying_type).base_type;
            pDVar1 = &local_90->super_Definition;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b8,"bit_flags",&local_1b9);
            pVVar5 = SymbolTable<flatbuffers::Value>::Lookup(&pDVar1->attributes,&local_1b8);
            local_611 = 0;
            if (pVVar5 != (Value *)0x0) {
              bVar2 = IsUnsigned(local_198);
              local_611 = bVar2 ^ 0xff;
            }
            std::__cxx11::string::~string((string *)&local_1b8);
            std::allocator<char>::~allocator(&local_1b9);
            if ((local_611 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1e0,"underlying type of bit_flags enum must be unsigned",
                         &local_1e1);
              Warning(this_01,&local_1e0);
              std::__cxx11::string::~string((string *)&local_1e0);
              std::allocator<char>::~allocator(&local_1e1);
            }
            pDVar1 = &local_90->super_Definition;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_208,"force_align",&local_209);
            pVVar5 = SymbolTable<flatbuffers::Value>::Lookup(&pDVar1->attributes,&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            std::allocator<char>::~allocator(&local_209);
            if (pVVar5 == (Value *)0x0) {
              EnumValBuilder::EnumValBuilder((EnumValBuilder *)local_258,this_01,local_90);
              local_259 = 0;
              Expect(this,t_00);
              enum_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
              if ((bool)enum_name.field_2._M_local_buf[8]) {
                local_259 = 1;
              }
              enum_name.field_2._9_3_ = 0;
              if ((local_259 & 1) == 0) {
                CheckedError::~CheckedError((CheckedError *)this);
              }
              if (enum_name.field_2._8_4_ == 0) {
                if (((((ulong)dest & 1) != 0) || (bVar2 = Is(this_01,0x7d), bVar2)) &&
                   (((this_01->opts).proto_mode & 1U) == 0)) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_280,"NONE",
                             (allocator<char> *)
                             ((long)&union_types._M_t._M_impl.super__Rb_tree_header._M_node_count +
                             7));
                  EnumValBuilder::CreateEnumerator((EnumValBuilder *)local_258,&local_280);
                  std::__cxx11::string::~string((string *)&local_280);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&union_types._M_t._M_impl.super__Rb_tree_header._M_node_count +
                             7));
                  union_types._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
                  EnumValBuilder::AcceptEnumerator((EnumValBuilder *)this);
                  enum_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
                  if ((bool)enum_name.field_2._M_local_buf[8]) {
                    union_types._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
                  }
                  enum_name.field_2._9_3_ = 0;
                  if ((union_types._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) == 0)
                  {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (enum_name.field_2._8_4_ != 0) goto LAB_00126fb5;
                }
                std::
                set<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::less<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::allocator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>_>
                ::set((set<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::less<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::allocator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>_>
                       *)local_2b8);
                do {
                  bVar2 = Is(this_01,0x7d);
                  if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_00126686:
                    local_38a = 0;
                    Expect(this,t_00);
                    enum_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
                    if ((bool)enum_name.field_2._M_local_buf[8]) {
                      local_38a = 1;
                    }
                    enum_name.field_2._9_3_ = 0;
                    if ((local_38a & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (enum_name.field_2._8_4_ == 0) {
                      sVar6 = EnumDef::size(local_90);
                      if (sVar6 != 0) {
                        pDVar1 = &local_90->super_Definition;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_3d8,"bit_flags",
                                   (allocator<char> *)((long)&base_width + 7));
                        pVVar5 = SymbolTable<flatbuffers::Value>::Lookup
                                           (&pDVar1->attributes,&local_3d8);
                        std::__cxx11::string::~string((string *)&local_3d8);
                        std::allocator<char>::~allocator((allocator<char> *)((long)&base_width + 7))
                        ;
                        if (pVVar5 == (Value *)0x0) goto LAB_00126b47;
                        sVar6 = SizeOf(local_198);
                        it._M_current = (EnumVal **)(sVar6 << 3);
                        pvVar7 = EnumDef::Vals(local_90);
                        local_3f0._M_current =
                             (EnumVal **)
                             std::
                             vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                             ::begin(pvVar7);
                        goto LAB_001268bd;
                      }
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_3b0,"incomplete enum declaration, values not found",
                                 &local_3b1);
                      Error(this,(string *)this_01);
                      std::__cxx11::string::~string(local_3b0);
                      std::allocator<char>::~allocator(&local_3b1);
                      enum_name.field_2._8_4_ = 1;
                    }
                    break;
                  }
                  if ((((this_01->opts).proto_mode & 1U) == 0) ||
                     (bVar2 = std::operator==(&(this_01->super_ParserState).attribute_,"option"),
                     !bVar2)) {
                    full_name.field_2._8_8_ =
                         EnumValBuilder::CreateEnumerator
                                   ((EnumValBuilder *)local_258,
                                    &(this_01->super_ParserState).attribute_);
                    std::__cxx11::string::string
                              ((string *)local_2e8,(string *)full_name.field_2._8_8_);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(full_name.field_2._8_8_ + 0x20),
                                &(this_01->super_ParserState).doc_comment_);
                    local_2e9 = 0;
                    Expect(this,t_00);
                    enum_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
                    if ((bool)enum_name.field_2._M_local_buf[8]) {
                      local_2e9 = 1;
                    }
                    enum_name.field_2._9_3_ = 0;
                    if ((local_2e9 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (enum_name.field_2._8_4_ == 0) {
                      if (((ulong)dest & 1) == 0) {
LAB_00126063:
                        bVar2 = Is(this_01,0x3d);
                        if (bVar2) {
                          local_381 = 0;
                          Next(this);
                          enum_name.field_2._M_local_buf[8] =
                               CheckedError::Check((CheckedError *)this);
                          if ((bool)enum_name.field_2._M_local_buf[8]) {
                            local_381 = 1;
                          }
                          enum_name.field_2._9_3_ = 0;
                          if ((local_381 & 1) == 0) {
                            CheckedError::~CheckedError((CheckedError *)this);
                          }
                          if (enum_name.field_2._8_4_ == 0) {
                            local_382 = 0;
                            EnumValBuilder::AssignEnumeratorValue
                                      ((EnumValBuilder *)this,(string *)local_258);
                            enum_name.field_2._M_local_buf[8] =
                                 CheckedError::Check((CheckedError *)this);
                            if ((bool)enum_name.field_2._M_local_buf[8]) {
                              local_382 = 1;
                            }
                            enum_name.field_2._9_3_ = 0;
                            if ((local_382 & 1) == 0) {
                              CheckedError::~CheckedError((CheckedError *)this);
                            }
                            if (enum_name.field_2._8_4_ == 0) {
                              local_383 = 0;
                              Expect(this,t_00);
                              enum_name.field_2._M_local_buf[8] =
                                   CheckedError::Check((CheckedError *)this);
                              if ((bool)enum_name.field_2._M_local_buf[8]) {
                                local_383 = 1;
                              }
                              enum_name.field_2._9_3_ = 0;
                              if ((local_383 & 1) == 0) {
                                CheckedError::~CheckedError((CheckedError *)this);
                              }
                              if (enum_name.field_2._8_4_ == 0) goto LAB_00126245;
                            }
                          }
                        }
                        else {
LAB_00126245:
                          if ((((this_01->opts).proto_mode & 1U) == 0) ||
                             (bVar2 = Is(this_01,0x5b), !bVar2)) {
                            local_387 = 0;
                            ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)this_01);
                            enum_name.field_2._M_local_buf[8] =
                                 CheckedError::Check((CheckedError *)this);
                            if ((bool)enum_name.field_2._M_local_buf[8]) {
                              local_387 = 1;
                            }
                            enum_name.field_2._9_3_ = 0;
                            if ((local_387 & 1) == 0) {
                              CheckedError::~CheckedError((CheckedError *)this);
                            }
joined_r0x001264db:
                            if (enum_name.field_2._8_4_ == 0) {
                              local_388 = 0;
                              EnumValBuilder::AcceptEnumerator((EnumValBuilder *)this);
                              enum_name.field_2._M_local_buf[8] =
                                   CheckedError::Check((CheckedError *)this);
                              if ((bool)enum_name.field_2._M_local_buf[8]) {
                                local_388 = 1;
                              }
                              enum_name.field_2._9_3_ = 0;
                              if ((local_388 & 1) == 0) {
                                CheckedError::~CheckedError((CheckedError *)this);
                              }
                              if (enum_name.field_2._8_4_ == 0) {
                                enum_name.field_2._8_4_ = 0;
                              }
                            }
                          }
                          else {
                            local_384 = 0;
                            Next(this);
                            enum_name.field_2._M_local_buf[8] =
                                 CheckedError::Check((CheckedError *)this);
                            if ((bool)enum_name.field_2._M_local_buf[8]) {
                              local_384 = 1;
                            }
                            enum_name.field_2._9_3_ = 0;
                            if ((local_384 & 1) == 0) {
                              CheckedError::~CheckedError((CheckedError *)this);
                            }
                            while (enum_name.field_2._8_4_ == 0) {
                              if ((this_01->super_ParserState).token_ == 0x5d) {
                                local_386 = 0;
                                Next(this);
                                enum_name.field_2._M_local_buf[8] =
                                     CheckedError::Check((CheckedError *)this);
                                if ((bool)enum_name.field_2._M_local_buf[8]) {
                                  local_386 = 1;
                                }
                                enum_name.field_2._9_3_ = 0;
                                if ((local_386 & 1) == 0) {
                                  CheckedError::~CheckedError((CheckedError *)this);
                                }
                                goto joined_r0x001264db;
                              }
                              local_385 = 0;
                              Next(this);
                              enum_name.field_2._M_local_buf[8] =
                                   CheckedError::Check((CheckedError *)this);
                              if ((bool)enum_name.field_2._M_local_buf[8]) {
                                local_385 = 1;
                              }
                              enum_name.field_2._9_3_ = 0;
                              if ((local_385 & 1) == 0) {
                                CheckedError::~CheckedError((CheckedError *)this);
                              }
                            }
                          }
                        }
                      }
                      else {
                        local_2ea = 0;
                        ParseNamespacing(this,(string *)this_01,(string *)local_2e8);
                        enum_name.field_2._M_local_buf[8] =
                             CheckedError::Check((CheckedError *)this);
                        if ((bool)enum_name.field_2._M_local_buf[8]) {
                          local_2ea = 1;
                        }
                        enum_name.field_2._9_3_ = 0;
                        if ((local_2ea & 1) == 0) {
                          CheckedError::~CheckedError((CheckedError *)this);
                        }
                        if (enum_name.field_2._8_4_ == 0) {
                          if (((this_01->opts).union_value_namespacing & 1U) != 0) {
                            std::__cxx11::string::operator=
                                      ((string *)full_name.field_2._8_8_,(string *)local_2e8);
                            local_2f8._M_current = (char *)std::__cxx11::string::begin();
                            local_300 = (char *)std::__cxx11::string::end();
                            local_301 = '.';
                            local_302 = '_';
                            std::
                            replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                      (local_2f8,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )local_300,&local_301,&local_302);
                          }
                          bVar2 = Is(this_01,0x3a);
                          if (!bVar2) {
                            _sd = LookupCreateStruct(this_01,(string *)local_2e8,true,false);
                            Type::Type((Type *)&ins.second,BASE_TYPE_STRUCT,_sd,(EnumDef *)0x0,0);
                            *(undefined8 *)(full_name.field_2._8_8_ + 0x38) = ins._8_8_;
                            *(undefined8 *)(full_name.field_2._8_8_ + 0x40) = local_348;
                            *(undefined8 *)(full_name.field_2._8_8_ + 0x48) = local_340;
                            *(undefined2 *)(full_name.field_2._8_8_ + 0x50) = local_338;
LAB_00125f95:
                            if ((local_90->uses_multiple_type_instances & 1U) == 0) {
                              pVar11 = std::
                                       make_pair<flatbuffers::BaseType&,flatbuffers::StructDef*&>
                                                 ((BaseType *)(full_name.field_2._8_8_ + 0x38),
                                                  (StructDef **)(full_name.field_2._8_8_ + 0x40));
                              local_370.second = pVar11.second;
                              local_370.first = pVar11.first;
                              pVar12 = std::
                                       set<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::less<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::allocator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>_>
                                       ::insert((set<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::less<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::allocator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>_>
                                                 *)local_2b8,&local_370);
                              local_380 = (_Base_ptr)pVar12.first._M_node;
                              local_378 = pVar12.second;
                              local_90->uses_multiple_type_instances =
                                   ((undefined1  [16])pVar12 & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0;
                              local_360 = local_380;
                              ins.first._M_node._0_1_ = local_378;
                            }
                            goto LAB_00126063;
                          }
                          local_303 = 0;
                          Next(this);
                          enum_name.field_2._M_local_buf[8] =
                               CheckedError::Check((CheckedError *)this);
                          if ((bool)enum_name.field_2._M_local_buf[8]) {
                            local_303 = 1;
                          }
                          enum_name.field_2._9_3_ = 0;
                          if ((local_303 & 1) == 0) {
                            CheckedError::~CheckedError((CheckedError *)this);
                          }
                          if (enum_name.field_2._8_4_ == 0) {
                            local_304 = 0;
                            ParseType(this,(Type *)this_01);
                            enum_name.field_2._M_local_buf[8] =
                                 CheckedError::Check((CheckedError *)this);
                            if ((bool)enum_name.field_2._M_local_buf[8]) {
                              local_304 = 1;
                            }
                            enum_name.field_2._9_3_ = 0;
                            if ((local_304 & 1) == 0) {
                              CheckedError::~CheckedError((CheckedError *)this);
                            }
                            if (enum_name.field_2._8_4_ == 0) {
                              if ((*(int *)(full_name.field_2._8_8_ + 0x38) == 0xf) ||
                                 (*(int *)(full_name.field_2._8_8_ + 0x38) == 0xd))
                              goto LAB_00125f95;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_328,
                                         "union value type may only be table/struct/string",
                                         &local_329);
                              Error(this,(string *)this_01);
                              std::__cxx11::string::~string(local_328);
                              std::allocator<char>::~allocator(&local_329);
                              enum_name.field_2._8_4_ = 1;
                            }
                          }
                        }
                      }
                    }
                    std::__cxx11::string::~string((string *)local_2e8);
                  }
                  else {
                    ParseProtoOption(this);
                    enum_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
                    enum_name.field_2._9_3_ = 0;
                    if (!(bool)enum_name.field_2._M_local_buf[8]) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                  }
                  if (enum_name.field_2._8_4_ != 0) break;
                  local_69a = ';';
                  if (((this_01->opts).proto_mode & 1U) == 0) {
                    local_69a = ',';
                  }
                  bVar2 = Is(this_01,(int)local_69a);
                  if (!bVar2) goto LAB_00126686;
                  local_389 = 0;
                  Next(this);
                  enum_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
                  if ((bool)enum_name.field_2._M_local_buf[8]) {
                    local_389 = 1;
                  }
                  enum_name.field_2._9_3_ = 0;
                  if ((local_389 & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                } while (enum_name.field_2._8_4_ == 0);
                goto LAB_00126f99;
              }
              goto LAB_00126fb5;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_230,"`force_align` is not a valid attribute for Enums. ",
                       (allocator<char> *)&evb.field_0x1f);
            Error(this,(string *)this_01);
            std::__cxx11::string::~string(local_230);
            std::allocator<char>::~allocator((allocator<char> *)&evb.field_0x1f);
            enum_name.field_2._8_4_ = 1;
          }
        }
        else {
          local_12b = 0;
          ParseType(this,(Type *)this_01);
          enum_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
          if ((bool)enum_name.field_2._M_local_buf[8]) {
            local_12b = 1;
          }
          enum_name.field_2._9_3_ = 0;
          if ((local_12b & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (enum_name.field_2._8_4_ == 0) {
            bVar2 = IsInteger((local_90->underlying_type).base_type);
            if ((bVar2) && (bVar2 = IsBool((local_90->underlying_type).base_type), !bVar2)) {
              (local_90->underlying_type).enum_def = local_90;
              goto LAB_00125406;
            }
            __s = "enum";
            if (((ulong)dest & 1) != 0) {
              __s = "union";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&underlying_type,__s,&local_191);
            std::operator+(&local_170,"underlying ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &underlying_type);
            std::operator+(&local_150,&local_170,"type must be integral");
            Error(this,(string *)this_01);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&underlying_type);
            std::allocator<char>::~allocator(&local_191);
            enum_name.field_2._8_4_ = 1;
          }
        }
      }
    }
  }
  goto LAB_00126fd1;
LAB_001268bd:
  pvVar7 = EnumDef::Vals(local_90);
  ev_1 = (EnumVal *)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar7);
  bVar2 = __gnu_cxx::operator!=
                    (&local_3f0,
                     (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                      *)&ev_1);
  if (!bVar2) goto LAB_00126b47;
  ppEVar8 = __gnu_cxx::
            __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
            ::operator*(&local_3f0);
  u = (uint64_t)*ppEVar8;
  local_408 = (EnumVal **)EnumVal::GetAsUInt64((EnumVal *)u);
  bVar2 = IsUnsigned(local_198);
  if ((!bVar2) && (local_408 == it._M_current - 1U)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_428,"underlying type of bit_flags enum must be unsigned",&local_429);
    Error(this,(string *)this_01);
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator(&local_429);
    enum_name.field_2._8_4_ = 1;
    goto LAB_00126f99;
  }
  if (it._M_current <= local_408) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_450,"bit flag out of range of underlying integral type",
               (allocator<char> *)((long)&prev_it._M_current + 7));
    Error(this,(string *)this_01);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)((long)&prev_it._M_current + 7));
    enum_name.field_2._8_4_ = 1;
    goto LAB_00126f99;
  }
  EnumDef::ChangeEnumValue<unsigned_long_long>(local_90,(EnumVal *)u,1L << ((byte)local_408 & 0x3f))
  ;
  __gnu_cxx::
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  ::operator++(&local_3f0);
  goto LAB_001268bd;
LAB_00126b47:
  EnumDef::SortByValue(local_90);
  pvVar7 = EnumDef::Vals(local_90);
  it_1._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar7);
  local_468 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator+(&it_1,1);
  while( true ) {
    pvVar7 = EnumDef::Vals(local_90);
    prev_ev = (EnumVal *)
              std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                        (pvVar7);
    bVar2 = __gnu_cxx::operator!=
                      (&local_468,
                       (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                        *)&prev_ev);
    if (!bVar2) break;
    ppEVar8 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&it_1);
    ev_2 = *ppEVar8;
    ppEVar8 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_468);
    local_480 = *ppEVar8;
    uVar9 = EnumVal::GetAsUInt64(ev_2);
    uVar10 = EnumVal::GetAsUInt64(local_480);
    if (uVar9 == uVar10) {
      std::operator+(&local_520,"all enum values must be unique: ",&ev_2->name);
      std::operator+(&local_500,&local_520," and ");
      std::operator+(&local_4e0,&local_500,&local_480->name);
      std::operator+(&local_4c0,&local_4e0," are both ");
      t = EnumVal::GetAsInt64(local_480);
      NumToString<long>((string *)((long)&qualified_name.field_2 + 8),t);
      std::operator+(&local_4a0,&local_4c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&qualified_name.field_2 + 8));
      Error(this,(string *)this_01);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)(qualified_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_520);
      enum_name.field_2._8_4_ = 1;
      goto LAB_00126f99;
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_468);
  }
  if (filename != (char *)0x0) {
    *(EnumDef **)filename = local_90;
  }
  Namespace::GetFullyQualifiedName
            ((string *)local_560,this_01->current_namespace_,(string *)local_90,1000);
  this_00 = (Type *)operator_new(0x20);
  Type::Type(this_00,BASE_TYPE_UNION,(StructDef *)0x0,local_90,0);
  bVar2 = SymbolTable<flatbuffers::Type>::Add(&this_01->types_,(string *)local_560,this_00);
  if (bVar2) {
    std::operator+(&local_580,"datatype already exists: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560);
    Error(this,(string *)this_01);
    std::__cxx11::string::~string((string *)&local_580);
  }
  else {
    anon_unknown_0::NoError();
  }
  enum_name.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_560);
LAB_00126f99:
  std::
  set<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::less<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::allocator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>_>
  ::~set((set<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::less<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::allocator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>_>
          *)local_2b8);
LAB_00126fb5:
  EnumValBuilder::~EnumValBuilder((EnumValBuilder *)local_258);
LAB_00126fd1:
  std::__cxx11::string::~string(local_80);
LAB_00126fe7:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseEnum(const bool is_union, EnumDef **dest,
                               const char *filename) {
  std::vector<std::string> enum_comment = doc_comment_;
  NEXT();
  std::string enum_name = attribute_;
  EXPECT(kTokenIdentifier);
  EnumDef *enum_def;
  ECHECK(StartEnum(enum_name, is_union, &enum_def));
  if (filename != nullptr && !opts.project_root.empty()) {
    enum_def->declaration_file =
        &GetPooledString(FilePath(opts.project_root, filename, opts.binary_schema_absolute_paths));
  }
  enum_def->doc_comment = enum_comment;
  if (!opts.proto_mode) {
    // Give specialized error message, since this type spec used to
    // be optional in the first FlatBuffers release.
    bool explicit_underlying_type = false;
    if (!Is(':')) {
      // Enum is forced to have an explicit underlying type in declaration.
      if (!is_union) {
        return Error(
            "must specify the underlying integer type for this"
            " enum (e.g. \': short\', which was the default).");
      }
    } else {
      // Union underlying type is only supported for cpp
      if (is_union && !SupportsUnionUnderlyingType()) {
        return Error(
            "Underlying type for union is not yet supported in at least one of "
            "the specified programming languages.");
      }
      NEXT();
      explicit_underlying_type = true;
    }

    if (explicit_underlying_type) {
      // Specify the integer type underlying this enum.
      ECHECK(ParseType(enum_def->underlying_type));
      if (!IsInteger(enum_def->underlying_type.base_type) || IsBool(enum_def->underlying_type.base_type)) {
        return Error("underlying " + std::string(is_union ? "union" : "enum") + "type must be integral");
      }
        
      // Make this type refer back to the enum it was derived from.
      enum_def->underlying_type.enum_def = enum_def;
    }

  }
  ECHECK(ParseMetaData(&enum_def->attributes));
  const auto underlying_type = enum_def->underlying_type.base_type;
  if (enum_def->attributes.Lookup("bit_flags") &&
      !IsUnsigned(underlying_type)) {
    // todo: Convert to the Error in the future?
    Warning("underlying type of bit_flags enum must be unsigned");
  }
  if (enum_def->attributes.Lookup("force_align")) {
    return Error("`force_align` is not a valid attribute for Enums. ");
  }
  EnumValBuilder evb(*this, *enum_def);
  EXPECT('{');
  // A lot of code generatos expect that an enum is not-empty.
  if ((is_union || Is('}')) && !opts.proto_mode) {
    evb.CreateEnumerator("NONE");
    ECHECK(evb.AcceptEnumerator());
  }
  std::set<std::pair<BaseType, StructDef *>> union_types;
  while (!Is('}')) {
    if (opts.proto_mode && attribute_ == "option") {
      ECHECK(ParseProtoOption());
    } else {
      auto &ev = *evb.CreateEnumerator(attribute_);
      auto full_name = ev.name;
      ev.doc_comment = doc_comment_;
      EXPECT(kTokenIdentifier);
      if (is_union) {
        ECHECK(ParseNamespacing(&full_name, &ev.name));
        if (opts.union_value_namespacing) {
          // Since we can't namespace the actual enum identifiers, turn
          // namespace parts into part of the identifier.
          ev.name = full_name;
          std::replace(ev.name.begin(), ev.name.end(), '.', '_');
        }
        if (Is(':')) {
          NEXT();
          ECHECK(ParseType(ev.union_type));
          if (ev.union_type.base_type != BASE_TYPE_STRUCT &&
              ev.union_type.base_type != BASE_TYPE_STRING)
            return Error("union value type may only be table/struct/string");
        } else {
          ev.union_type = Type(BASE_TYPE_STRUCT, LookupCreateStruct(full_name));
        }
        if (!enum_def->uses_multiple_type_instances) {
          auto ins = union_types.insert(std::make_pair(
              ev.union_type.base_type, ev.union_type.struct_def));
          enum_def->uses_multiple_type_instances = (false == ins.second);
        }
      }

      if (Is('=')) {
        NEXT();
        ECHECK(evb.AssignEnumeratorValue(attribute_));
        EXPECT(kTokenIntegerConstant);
      }

      if (opts.proto_mode && Is('[')) {
        NEXT();
        // ignore attributes on enums.
        while (token_ != ']') NEXT();
        NEXT();
      } else {
        // parse attributes in fbs schema
        ECHECK(ParseMetaData(&ev.attributes));
      }

      ECHECK(evb.AcceptEnumerator());
    }
    if (!Is(opts.proto_mode ? ';' : ',')) break;
    NEXT();
  }
  EXPECT('}');

  // At this point, the enum can be empty if input is invalid proto-file.
  if (!enum_def->size())
    return Error("incomplete enum declaration, values not found");

  if (enum_def->attributes.Lookup("bit_flags")) {
    const auto base_width = static_cast<uint64_t>(8 * SizeOf(underlying_type));
    for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
         ++it) {
      auto ev = *it;
      const auto u = ev->GetAsUInt64();
      // Stop manipulations with the sign.
      if (!IsUnsigned(underlying_type) && u == (base_width - 1))
        return Error("underlying type of bit_flags enum must be unsigned");
      if (u >= base_width)
        return Error("bit flag out of range of underlying integral type");
      enum_def->ChangeEnumValue(ev, 1ULL << u);
    }
  }

  enum_def->SortByValue();  // Must be sorted to use MinValue/MaxValue.

  // Ensure enum value uniqueness.
  auto prev_it = enum_def->Vals().begin();
  for (auto it = prev_it + 1; it != enum_def->Vals().end(); ++it) {
    auto prev_ev = *prev_it;
    auto ev = *it;
    if (prev_ev->GetAsUInt64() == ev->GetAsUInt64())
      return Error("all enum values must be unique: " + prev_ev->name +
                   " and " + ev->name + " are both " +
                   NumToString(ev->GetAsInt64()));
  }

  if (dest) *dest = enum_def;
  const auto qualified_name =
      current_namespace_->GetFullyQualifiedName(enum_def->name);
  if (types_.Add(qualified_name, new Type(BASE_TYPE_UNION, nullptr, enum_def)))
    return Error("datatype already exists: " + qualified_name);
  return NoError();
}